

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfClearNamedBufferData(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  uint *puVar10;
  byte bVar11;
  GLuint not_a_buffer_name;
  GLuint GVar12;
  GLenum GVar13;
  GLenum *pGVar14;
  ulong uVar15;
  GLbyte dummy_data;
  GLuint buffer;
  GLenum invalid_type;
  GLenum invalid_format;
  undefined1 local_41;
  GLuint local_40;
  byte local_39;
  GLenum local_38;
  GLenum local_34;
  long lVar9;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  local_40 = 0;
  local_41 = 0;
  (**(code **)(lVar9 + 0x3b8))(1);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xa59);
  (*this->m_pNamedBufferStorage)(local_40,1,&local_41,0x43);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glNamedBufferStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xa5d);
  GVar12 = 0;
  do {
    GVar12 = GVar12 + 1;
    cVar1 = (**(code **)(lVar9 + 0xc68))(GVar12);
  } while (cVar1 != '\0');
  (*this->m_pClearNamedBufferData)(GVar12,0x8229,0x1903,0x1401,&local_41);
  bVar2 = ErrorCheckAndLog(this,"glClearNamedBufferData",0x502,
                           " if buffer is not the name of an existing buffer object.");
  GVar13 = 0;
  do {
    GVar13 = GVar13 + 1;
    uVar15 = 9;
    pGVar14 = TestErrorsOfClearNamedBufferData::valid_internal_formats + 2;
    do {
      if (pGVar14[-2] == GVar13) {
        pGVar14 = pGVar14 + -2;
        goto LAB_00a8a221;
      }
      if (pGVar14[-1] == GVar13) {
        pGVar14 = pGVar14 + -1;
        goto LAB_00a8a221;
      }
      if (*pGVar14 == GVar13) goto LAB_00a8a221;
      if (pGVar14[1] == GVar13) {
        pGVar14 = pGVar14 + 1;
        goto LAB_00a8a221;
      }
      uVar15 = uVar15 - 1;
      pGVar14 = pGVar14 + 4;
    } while (1 < uVar15);
    pGVar14 = TestErrorsOfClearNamedBufferData::valid_internal_formats + 0x20;
    if (GVar13 != 0x8d70) break;
LAB_00a8a221:
  } while (pGVar14 != TestErrorsOfClearNamedBufferData::valid_internal_formats + 0x21);
  (*this->m_pClearNamedBufferData)(local_40,GVar13,0x1903,0x1401,&local_41);
  local_39 = ErrorCheckAndLog(this,"glClearNamedBufferData",0x500,
                              " if internal format is not one of the valid sized internal formats (GL_R8, GL_R16, GL_R16F, GL_R32F, GL_R8I, GL_R16I, GL_R32I, GL_R8UI, GL_R16UI, GL_R32UI, GL_RG8, GL_RG16, GL_RG16F, GL_RG32F, GL_RG8I, GL_RG16I, GL_RG32I, GL_RG8UI, GL_RG16UI, GL_RG32UI, GL_RGB32F, GL_RGB32I, GL_RGB32UI, GL_RGBA8, GL_RGBA16, GL_RGBA16F, GL_RGBA32F, GL_RGBA8I, GL_RGBA16I, GL_RGBA32I, GL_RGBA8UI, GL_RGBA16UI, GL_RGBA32UI)."
                             );
  (*this->m_pMapNamedBuffer)(local_40,35000);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xa91);
  (*this->m_pClearNamedBufferData)(local_40,0x8229,0x1903,0x1401,&local_41);
  bVar3 = ErrorCheckAndLog(this,"glClearNamedBufferData",0x502,
                           " if any part of the specified range of the buffer object is mapped with MapBuffer, unless it was mapped with the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags."
                          );
  (*this->m_pUnmapNamedBuffer)(local_40);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xa9b);
  (*this->m_pMapNamedBufferRange)(local_40,0,1,1);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xaa1);
  (*this->m_pClearNamedBufferData)(local_40,0x8229,0x1903,0x1401,&local_41);
  bVar4 = ErrorCheckAndLog(this,"glClearNamedBufferData",0x502,
                           " if any part of the specified range of the buffer object is mapped with MapBufferRange, unless it was mapped with the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags."
                          );
  (*this->m_pUnmapNamedBuffer)(local_40);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xaab);
  (*this->m_pMapNamedBufferRange)(local_40,0,1,0x41);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xab2);
  (*this->m_pClearNamedBufferData)(local_40,0x8229,0x1903,0x1401,&local_41);
  bVar5 = ErrorCheckAndLog(this,"glClearNamedBufferData",0,
                           " if any part of the specified range of the buffer object is mapped with MapBuffer with the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags."
                          );
  (*this->m_pUnmapNamedBuffer)(local_40);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xabc);
  bVar11 = bVar2 & local_39;
  local_34 = 0;
  do {
    local_34 = local_34 + 1;
    puVar10 = std::
              __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        (TestErrorsOfClearNamedBufferData::valid_formats,0x1ac1f38,&local_34);
  } while (puVar10 != TestErrorsOfClearNamedBufferData::valid_formats + 0xe);
  (*this->m_pClearNamedBufferData)(local_40,0x8229,local_34,0x1401,&local_41);
  bVar2 = ErrorCheckAndLog(this,"glClearNamedBufferData",0x500,
                           " if format is not a valid format (one of GL_RED, GL_RG, GL_RGB, GL_BGR, GL_RGBA, GL_BGRA, GL_RED_INTEGER, GL_RG_INTEGER, GL_RGB_INTEGER, GL_BGR_INTEGER, GL_RGBA_INTEGER, GL_BGRA_INTEGER, GL_STENCIL_INDEX, GL_DEPTH_COMPONENT, GL_DEPTH_STENCIL)."
                          );
  local_38 = 0;
  do {
    local_38 = local_38 + 1;
    puVar10 = std::
              __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        (TestErrorsOfClearNamedBufferData::valid_types,0x1ac1f78,&local_38);
  } while (puVar10 != TestErrorsOfClearNamedBufferData::valid_types + 0xe);
  (*this->m_pClearNamedBufferData)(local_40,0x8229,0x1903,local_38,&local_41);
  bVar6 = ErrorCheckAndLog(this,"glClearNamedBufferData",0x500,
                           " if format is not a valid type (one of GL_UNSIGNED_BYTE, GL_BYTE, GL_UNSIGNED_SHORT, GL_SHORT, GL_UNSIGNED_INT, GL_INT, GL_FLOAT, GL_UNSIGNED_BYTE_3_3_2, GL_UNSIGNED_BYTE_2_3_3_REV, GL_UNSIGNED_SHORT_5_6_5, GL_UNSIGNED_SHORT_5_6_5_REV, GL_UNSIGNED_SHORT_4_4_4_4, GL_UNSIGNED_SHORT_4_4_4_4_REV, GL_UNSIGNED_SHORT_5_5_5_1, GL_UNSIGNED_SHORT_1_5_5_5_REV, GL_UNSIGNED_INT_8_8_8_8, GL_UNSIGNED_INT_8_8_8_8_REV, GL_UNSIGNED_INT_10_10_10_2, and GL_UNSIGNED_INT_2_10_10_10_REV)."
                          );
  if (local_40 != 0) {
    (**(code **)(lVar9 + 0x438))(1,&local_40);
  }
  return (bool)(bVar11 & bVar3 & bVar4 & bVar5 & bVar2 & bVar6);
}

Assistant:

bool ErrorsTest::TestErrorsOfClearNamedBufferData()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint buffer	 = 0;
	glw::GLbyte dummy_data = 0;

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pClearNamedBufferData(not_a_buffer_name, GL_R8, GL_RED, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferData", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test invalid sized internal format error behavior. */
		{
			/* Prepare for invalid sized internal format error behavior verification. */
			static const glw::GLenum valid_internal_formats[] = {
				GL_R8,		GL_R16,		GL_R16F,	GL_R32F,	 GL_R8I,	  GL_R16I,	GL_R32I,
				GL_R8UI,	GL_R16UI,   GL_R32UI,   GL_RG8,		 GL_RG16,	 GL_RG16F,   GL_RG32F,
				GL_RG8I,	GL_RG16I,   GL_RG32I,   GL_RG8UI,	GL_RG16UI,   GL_RG32UI,  GL_RGB32F,
				GL_RGB32I,  GL_RGB32UI, GL_RGBA8,   GL_RGBA16,   GL_RGBA16F,  GL_RGBA32F, GL_RGBA8I,
				GL_RGBA16I, GL_RGBA32I, GL_RGBA8UI, GL_RGBA16UI, GL_RGBA32UI, GL_NONE
			};
			static const glw::GLenum valid_internal_formats_last =
				sizeof(valid_internal_formats) / sizeof(valid_internal_formats[0]) - 1;

			glw::GLenum invalid_internal_format = 0;

			while (&valid_internal_formats[valid_internal_formats_last] !=
				   std::find(&valid_internal_formats[0], &valid_internal_formats[valid_internal_formats_last],
							 (++invalid_internal_format)))
				;

			/* Test. */
			m_pClearNamedBufferData(buffer, invalid_internal_format, GL_RED, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferData", GL_INVALID_ENUM,
									  " if internal format is not one of the valid sized internal formats "
									  "(GL_R8, GL_R16, GL_R16F, GL_R32F, GL_R8I, GL_R16I, GL_R32I, GL_R8UI,"
									  " GL_R16UI, GL_R32UI, GL_RG8, GL_RG16, GL_RG16F, GL_RG32F, GL_RG8I, GL_RG16I,"
									  " GL_RG32I, GL_RG8UI, GL_RG16UI, GL_RG32UI, GL_RGB32F, GL_RGB32I, GL_RGB32UI,"
									  " GL_RGBA8, GL_RGBA16, GL_RGBA16F, GL_RGBA32F, GL_RGBA8I, GL_RGBA16I, GL_RGBA32I,"
									  " GL_RGBA8UI, GL_RGBA16UI, GL_RGBA32UI).");
		}

		/* Test of mapped buffer clear error behavior verification (glMapNamedBuffer version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBuffer(buffer, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pClearNamedBufferData(buffer, GL_R8, GL_RED, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferData", GL_INVALID_OPERATION,
									  " if any part of the specified range of the buffer"
									  " object is mapped with MapBuffer, unless it was mapped with "
									  "the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of mapped buffer clear error behavior verification (glMapNamedBufferRange version). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pClearNamedBufferData(buffer, GL_R8, GL_RED, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferData", GL_INVALID_OPERATION,
									  " if any part of the specified range of the buffer"
									  " object is mapped with MapBufferRange, unless it was mapped with "
									  "the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of persistently mapped buffer clear error with behavior verification (glMapNamedBufferRange version). */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pClearNamedBufferData(buffer, GL_R8, GL_RED, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog("glClearNamedBufferData", GL_NO_ERROR,
									  " if any part of the specified range of the buffer"
									  " object is mapped with MapBuffer with the MAP_PERSISTENT_BIT"
									  " bit set in the MapBufferRange access flags.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test invalid format error behavior. */
		{
			/* Prepare for invalid format error behavior verification. */
			static const glw::GLenum valid_formats[] = { GL_RED,		   GL_RG,
														 GL_RGB,		   GL_BGR,
														 GL_RGBA,		   GL_BGRA,
														 GL_RED_INTEGER,   GL_RG_INTEGER,
														 GL_RGB_INTEGER,   GL_BGR_INTEGER,
														 GL_RGBA_INTEGER,  GL_BGRA_INTEGER,
														 GL_STENCIL_INDEX, GL_DEPTH_COMPONENT,
														 GL_DEPTH_STENCIL };
			static const glw::GLenum valid_formats_last = sizeof(valid_formats) / sizeof(valid_formats[0]) - 1;

			glw::GLenum invalid_format = 0;

			while (&valid_formats[valid_formats_last] !=
				   std::find(&valid_formats[0], &valid_formats[valid_formats_last], (++invalid_format)))
				;

			/* Test. */
			m_pClearNamedBufferData(buffer, GL_R8, invalid_format, GL_UNSIGNED_BYTE, &dummy_data);

			is_ok &= ErrorCheckAndLog(
				"glClearNamedBufferData", GL_INVALID_ENUM,
				" if format is not a valid format "
				"(one of GL_RED, GL_RG, GL_RGB, GL_BGR, GL_RGBA, GL_BGRA, "
				"GL_RED_INTEGER, GL_RG_INTEGER, GL_RGB_INTEGER, GL_BGR_INTEGER, GL_RGBA_INTEGER, GL_BGRA_INTEGER, "
				"GL_STENCIL_INDEX, GL_DEPTH_COMPONENT, GL_DEPTH_STENCIL).");
		}

		/* Test invalid type error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			static const glw::GLenum valid_types[] = { GL_RED,			 GL_RG,
													   GL_RGB,			 GL_BGR,
													   GL_RGBA,			 GL_BGRA,
													   GL_RED_INTEGER,   GL_RG_INTEGER,
													   GL_RGB_INTEGER,   GL_BGR_INTEGER,
													   GL_RGBA_INTEGER,  GL_BGRA_INTEGER,
													   GL_STENCIL_INDEX, GL_DEPTH_COMPONENT,
													   GL_DEPTH_STENCIL };
			static const glw::GLenum valid_types_last = sizeof(valid_types) / sizeof(valid_types[0]) - 1;

			glw::GLenum invalid_type = 0;

			while (&valid_types[valid_types_last] !=
				   std::find(&valid_types[0], &valid_types[valid_types_last], (++invalid_type)))
				;

			/* Test. */
			m_pClearNamedBufferData(buffer, GL_R8, GL_RED, invalid_type, &dummy_data);

			is_ok &= ErrorCheckAndLog(
				"glClearNamedBufferData", GL_INVALID_ENUM,
				" if format is not a valid type "
				"(one of GL_UNSIGNED_BYTE, GL_BYTE, GL_UNSIGNED_SHORT, "
				"GL_SHORT, GL_UNSIGNED_INT, GL_INT, GL_FLOAT, GL_UNSIGNED_BYTE_3_3_2, "
				"GL_UNSIGNED_BYTE_2_3_3_REV, GL_UNSIGNED_SHORT_5_6_5, "
				"GL_UNSIGNED_SHORT_5_6_5_REV, GL_UNSIGNED_SHORT_4_4_4_4, GL_UNSIGNED_SHORT_4_4_4_4_REV, "
				"GL_UNSIGNED_SHORT_5_5_5_1, GL_UNSIGNED_SHORT_1_5_5_5_REV, GL_UNSIGNED_INT_8_8_8_8, "
				"GL_UNSIGNED_INT_8_8_8_8_REV, GL_UNSIGNED_INT_10_10_10_2, and GL_UNSIGNED_INT_2_10_10_10_REV).");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}